

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_stack.c
# Opt level: O2

void adt_stack_resize(adt_stack_t *self,uint32_t u32Len)

{
  uint uVar1;
  void **__dest;
  void **__src;
  char *__assertion;
  uint32_t uVar2;
  uint32_t u32i;
  ulong uVar3;
  ulong uVar4;
  
  if (self != (adt_stack_t *)0x0) {
    uVar4 = (ulong)u32Len;
    uVar1 = self->u32AllocLen;
    uVar3 = (ulong)uVar1;
    if (uVar1 != u32Len) {
      uVar2 = self->u32CurLen;
      if (uVar1 < uVar2) {
        __assertion = "self->u32AllocLen>=self->u32CurLen";
        uVar1 = 0x7c;
LAB_0010713e:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_stack.c"
                      ,uVar1,"void adt_stack_resize(adt_stack_t *, uint32_t)");
      }
      if (u32Len == 0) {
        __dest = (void **)0x0;
      }
      else {
        __dest = (void **)malloc(uVar4 * 8);
        if (__dest == (void **)0x0) {
          __assertion = "ppAlloc != 0";
          uVar1 = 0x7f;
          goto LAB_0010713e;
        }
      }
      __src = self->ppAlloc;
      if (__src != (void **)0x0) {
        if (((u32Len <= uVar1) && (uVar3 = uVar4, u32Len < uVar2)) &&
           (self->pDestructor != (_func_void_void_ptr *)0x0)) {
          for (; uVar4 < uVar2; uVar4 = uVar4 + 1) {
            (*self->pDestructor)(self->ppAlloc[uVar4]);
            uVar2 = self->u32CurLen;
          }
          __src = self->ppAlloc;
        }
        memcpy(__dest,__src,uVar3 << 3);
        free(__src);
      }
      self->ppAlloc = __dest;
      self->u32AllocLen = u32Len;
    }
  }
  return;
}

Assistant:

void adt_stack_resize(adt_stack_t *self,uint32_t u32Len){
	void **ppAlloc = (void**) 0;
	if(!self) return;
	if(u32Len == self->u32AllocLen) return; //nothing to do

	assert(self->u32AllocLen>=self->u32CurLen);
	if(u32Len>0){
		ppAlloc = (void**) malloc(u32Len * sizeof(void*));
		assert(ppAlloc != 0);
	}
	if(self->ppAlloc){
		if(u32Len > self->u32AllocLen){
			//grow
			memcpy(ppAlloc,self->ppAlloc,self->u32AllocLen * sizeof(void*));
		}
		else{
			//shrink
			if( self->u32CurLen > u32Len){
				//call destructor on superfluous elements
				if(self->pDestructor){
					uint32_t u32i;
					for(u32i=u32Len; u32i < self->u32CurLen;u32i++){
						self->pDestructor(self->ppAlloc[u32i]);
					}
				}
			}
			memcpy(ppAlloc,self->ppAlloc,u32Len * sizeof(void*));
		}
		free(self->ppAlloc);
	}
	self->ppAlloc = ppAlloc;
	self->u32AllocLen = u32Len;

}